

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O2

void __thiscall
cppcms::impl::mem_cache<cppcms::impl::process_settings>::clear
          (mem_cache<cppcms::impl::process_settings> *this)

{
  wrlock_guard lock;
  _Head_base<0UL,_cppcms::impl::shared_mutex_*,_false> local_10;
  
  local_10._M_head_impl =
       (this->access_lock)._M_t.
       super___uniq_ptr_impl<cppcms::impl::shared_mutex,_std::default_delete<cppcms::impl::shared_mutex>_>
       ._M_t.
       super__Tuple_impl<0UL,_cppcms::impl::shared_mutex_*,_std::default_delete<cppcms::impl::shared_mutex>_>
       .super__Head_base<0UL,_cppcms::impl::shared_mutex_*,_false>._M_head_impl;
  shared_mutex::wrlock(local_10._M_head_impl);
  nl_clear(this);
  shared_mutex::unique_guard::~unique_guard((unique_guard *)&local_10);
  return;
}

Assistant:

virtual void clear()
	{
		wrlock_guard lock(*access_lock);
		nl_clear();
	}